

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

PrefixedLogger * __thiscall
phosg::PrefixedLogger::sub
          (PrefixedLogger *__return_storage_ptr__,PrefixedLogger *this,string *prefix,
          LogLevel min_level)

{
  LogLevel local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  LogLevel local_24;
  string *psStack_20;
  LogLevel min_level_local;
  string *prefix_local;
  PrefixedLogger *this_local;
  
  local_24 = min_level;
  psStack_20 = prefix;
  prefix_local = &this->prefix;
  this_local = __return_storage_ptr__;
  ::std::operator+(&local_48,&this->prefix,prefix);
  if (local_24 == USE_DEFAULT) {
    local_74 = this->min_level;
  }
  else {
    local_74 = local_24;
  }
  PrefixedLogger(__return_storage_ptr__,&local_48,local_74);
  ::std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

PrefixedLogger PrefixedLogger::sub(const std::string& prefix, LogLevel min_level) const {
  return PrefixedLogger(this->prefix + prefix, min_level == LogLevel::USE_DEFAULT ? this->min_level : min_level);
}